

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void TldAsKey::CanonicCopy
               (uint8_t *tldDest,size_t tldDestMax,size_t *tldDestLength,uint8_t *tldSrce,
               size_t tldSrceLength)

{
  byte local_3c;
  ulong uStack_38;
  int c;
  size_t i;
  size_t tldSrceLength_local;
  uint8_t *tldSrce_local;
  size_t *tldDestLength_local;
  size_t tldDestMax_local;
  uint8_t *tldDest_local;
  
  for (uStack_38 = 0; uStack_38 < tldSrceLength && uStack_38 < tldDestMax; uStack_38 = uStack_38 + 1
      ) {
    local_3c = tldSrce[uStack_38];
    if ((0x60 < local_3c) && (local_3c < 0x7b)) {
      local_3c = local_3c - 0x20;
    }
    tldDest[uStack_38] = local_3c;
  }
  *tldDestLength = uStack_38;
  tldDest[uStack_38] = '\0';
  return;
}

Assistant:

void TldAsKey::CanonicCopy(uint8_t * tldDest, size_t tldDestMax, size_t * tldDestLength, 
    uint8_t * tldSrce, size_t tldSrceLength)
{
    size_t i = 0;

    for (; i < tldSrceLength && i < tldDestMax; i++)
    {
        int c = tldSrce[i];

        if (c >= 'a' && c <= 'z')
        {
            c += 'A' - 'a';
        }

        tldDest[i] = c;
    }

    *tldDestLength = i;

    tldDest[i] = 0;
}